

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dl-intercept.cpp
# Opt level: O3

char * la_objsearch(char *name,uintptr_t *cookie,uint flag)

{
  undefined8 uVar1;
  char cVar2;
  char *__s;
  size_t sVar3;
  long lVar4;
  istream *piVar5;
  mapped_type *this;
  ostream *poVar6;
  pointer pbVar7;
  key_type *pkVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R14;
  __node_base *p_Var9;
  string line;
  string dl_substitutions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  substitution_pairs;
  string obj_name;
  undefined1 local_2c8 [40];
  is_any_ofF<char> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  char *local_250;
  iterator_range<const_char_*> local_248;
  anon_union_16_2_ba345be5_for_m_Storage local_238;
  ulong local_228 [2];
  byte abStack_218 [488];
  
  if (flag == 1) {
    if (initialized == '\0') {
      __s = getenv("RTLD_SUBSTITUTIONS");
      if (__s != (char *)0x0) {
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        sVar3 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,__s,__s + sVar3);
        local_268.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_268.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_268.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar4 = std::__cxx11::string::find((string *)&local_288,':',0);
        local_250 = name;
        if (lVar4 == -1) {
          std::ifstream::ifstream((ifstream *)local_238.m_fixSet);
          std::ifstream::open((ifstream *)local_238.m_fixSet,(string *)&local_288,_S_in);
          if ((abStack_218[*(ulong *)(local_238.m_dynSet + -0x18)] & 1) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"ERROR: Failure to open substitutions file ",0x2a);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_288._M_dataplus._M_p,
                                local_288._M_string_length);
            std::endl<char,std::char_traits<char>>(poVar6);
            exit(1);
          }
          local_2c8._8_8_ = (pointer)0x0;
          local_2c8._16_8_ = local_2c8._16_8_ & 0xffffffffffffff00;
          local_2c8._0_8_ = (key_type *)(local_2c8 + 0x10);
          while( true ) {
            cVar2 = std::ios::widen((ios *)(local_238.m_fixSet +
                                           *(ulong *)(local_238.m_dynSet + -0x18)),'\n');
            piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)local_238.m_fixSet,(string *)local_2c8,cVar2);
            if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
            local_2a0.m_Storage.m_dynSet = " ";
            local_2a0.m_Storage._8_8_ = (long)" " + 1;
            pbVar7 = (pointer)local_2c8._8_8_;
            pkVar8 = (key_type *)local_2c8._0_8_;
            if ((pointer)local_2c8._8_8_ != (pointer)0x0) {
              do {
                if (*(char *)&(pkVar8->_M_dataplus)._M_p == ' ') {
                  boost::algorithm::detail::
                  find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::empty_formatF<char>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::empty_container<char>>
                            ((value_type *)local_2c8,pkVar8,
                             (char *)((long)&(pkVar8->_M_dataplus)._M_p + 1));
                  break;
                }
                pbVar7 = (pointer)((long)&pbVar7[-1].field_2 + 0xf);
                pkVar8 = (key_type *)((long)&(pkVar8->_M_dataplus)._M_p + 1);
              } while (pbVar7 != (pointer)0x0);
              if ((((pointer)0x3 < (ulong)local_2c8._8_8_) && (*(char *)local_2c8._0_8_ != '#')) &&
                 (lVar4 = std::__cxx11::string::find((string *)local_2c8,':',0), lVar4 != -1)) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_268,(value_type *)local_2c8);
              }
            }
          }
          std::ifstream::close((ifstream *)local_238.m_fixSet);
          if ((key_type *)local_2c8._0_8_ != (key_type *)(local_2c8 + 0x10)) {
            operator_delete((void *)local_2c8._0_8_);
          }
          std::ifstream::~ifstream((ifstream *)local_238.m_fixSet);
        }
        else {
          local_2c8._0_8_ = ",";
          local_2c8._8_8_ = "";
          boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
                    ((is_any_ofF<char> *)&local_238,(iterator_range<const_char_*> *)local_2c8);
          boost::algorithm::
          split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                    (&local_268,&local_288,(is_any_ofF<char> *)&local_238,token_compress_off);
          if ((0x10 < local_228[0]) && ((ulong *)local_238.m_dynSet != (ulong *)0x0)) {
            operator_delete__(local_238.m_dynSet);
          }
        }
        pbVar7 = local_268.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        unaff_R14 = local_268.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        if (local_268.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_268.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            local_2c8._0_8_ = (key_type *)0x0;
            local_2c8._8_8_ = (pointer)0x0;
            local_2c8._16_8_ = 0;
            local_248.
            super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
            super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
            super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
            m_Begin = ":";
            local_248.
            super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
            super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
            super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
            m_End = "";
            boost::algorithm::detail::is_any_ofF<char>::
            is_any_ofF<boost::iterator_range<char_const*>>(&local_2a0,&local_248);
            boost::algorithm::
            split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2c8,unaff_R14,&local_2a0,token_compress_off);
            if ((0x10 < local_2a0.m_Size) && (local_2a0.m_Storage.m_dynSet != (char *)0x0)) {
              operator_delete__(local_2a0.m_Storage.m_dynSet);
            }
            uVar1 = local_2c8._8_8_;
            if (local_2c8._8_8_ - local_2c8._0_8_ == 0x40) {
              this = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&substitutions_abi_cxx11_,(key_type *)local_2c8._0_8_);
              std::__cxx11::string::_M_assign((string *)this,(string *)(uVar1 + -0x20));
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Formatting error in substitution pair: ",0x27);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(unaff_R14->_M_dataplus)._M_p,
                                  unaff_R14->_M_string_length);
              cVar2 = std::ios::widen((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)),'\n');
              poVar6 = (ostream *)std::ostream::put(poVar6,cVar2);
              std::ostream::flush(poVar6);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2c8);
            unaff_R14 = unaff_R14 + 1;
          } while (unaff_R14 != pbVar7);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_268);
        name = local_250;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p);
          name = local_250;
        }
      }
      initialized = '\x01';
    }
    std::__cxx11::string::string((string *)local_238.m_fixSet,name,(allocator *)&local_288);
    p_Var9 = &substitutions_abi_cxx11_._M_h._M_before_begin;
    do {
      p_Var9 = p_Var9->_M_nxt;
      if (p_Var9 == (__node_base *)0x0) goto LAB_0017fad1;
      lVar4 = std::__cxx11::string::find
                        ((string *)local_238.m_fixSet,(char *)p_Var9[1]._M_nxt,0,
                         (ulong)*(_Hash_node_base **)
                                 &((_Prime_rehash_policy *)(p_Var9 + 2))->_M_max_load_factor);
    } while (lVar4 == -1);
    unaff_R14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                p_Var9[5]._M_nxt;
LAB_0017fad1:
    if ((ulong *)local_238.m_dynSet != local_228) {
      operator_delete(local_238.m_dynSet);
    }
    if (p_Var9 != (__node_base *)0x0) {
      return (char *)unaff_R14;
    }
  }
  return name;
}

Assistant:

char *la_objsearch(const char *name, uintptr_t *cookie, unsigned int flag) {
  // Catch the initial name of the object the loader is looking for
  if(flag == LA_SER_ORIG) {
    // Initialize environment variables
    if(!initialized) {
      process_environment_variables();
      initialized = true;
    }

    std::string obj_name(name);

    for(auto const& kv : substitutions) {
      // If a searched name matches a key, return the mapped value
      // If the key is an absolute filepath the loader will not search anywhere else
      if(obj_name.find(kv.first) != std::string::npos) {
          return (char*)kv.second.c_str();
      }
    }
  }

  return (char*)name;
}